

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O2

void PoolCleanup(MemoryPool *pool)

{
  char *pcVar1;
  Page *pacVar2;
  Page *base;
  
  CleanupSweepables(pool);
  base = pool->pages;
  while (pacVar2 = base, base != (Page *)0x0) {
    do {
      pcVar1 = *pacVar2;
      pacVar2 = (Page *)(*(ulong *)pcVar1 & 0xffffffffffffff00);
    } while ((*(ulong *)pcVar1 & 0x20) == 0);
    SysPageFree(base);
    base = pacVar2;
  }
  return;
}

Assistant:

void
PoolCleanup(
    MemoryPool *pool)   /*!< Pool to cleanup. */
{
    Page *base, *next, *page;

    /*
     * Cleanup sweepable custom ropes (those with a freeProc).
     */

    CleanupSweepables(pool);

    /*
     * Free all system pages.
     */

    for (base = pool->pages; base; base = next) {
        for (page = base; !PAGE_FLAG(page, PAGE_FLAG_LAST);
                page = PAGE_NEXT(page));
        next = PAGE_NEXT(page);
        ASSERT(PAGE_FLAG(base, PAGE_FLAG_FIRST));
        SysPageFree(base);
    }
}